

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O0

void test_cpp_add_remove_checked(void **param_1)

{
  int i_1;
  int i;
  uint32_t values [4];
  Roaring roaring;
  uint32_t in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar1;
  undefined4 in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar2;
  
  ::roaring::Roaring::Roaring
            ((Roaring *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  for (iVar2 = 0; iVar2 < 4; iVar2 = iVar2 + 1) {
    ::roaring::Roaring::addChecked
              ((Roaring *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
    _assert_true(CONCAT44(iVar2,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8,
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
    ::roaring::Roaring::addChecked
              ((Roaring *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
    _assert_true(CONCAT44(iVar2,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8,
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 in_stack_ffffffffffffff9c);
  }
  for (iVar1 = 0; iVar1 < 4; iVar1 = iVar1 + 1) {
    ::roaring::Roaring::removeChecked
              ((Roaring *)CONCAT44(in_stack_ffffffffffffffa4,iVar1),in_stack_ffffffffffffff9c);
    _assert_true(CONCAT44(iVar2,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8,
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,iVar1),in_stack_ffffffffffffff9c);
    ::roaring::Roaring::removeChecked
              ((Roaring *)CONCAT44(in_stack_ffffffffffffffa4,iVar1),in_stack_ffffffffffffff9c);
    _assert_true(CONCAT44(iVar2,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8,
                 (char *)CONCAT44(in_stack_ffffffffffffffa4,iVar1),in_stack_ffffffffffffff9c);
  }
  ::roaring::Roaring::isEmpty((Roaring *)CONCAT44(in_stack_ffffffffffffffa4,iVar1));
  _assert_true(CONCAT44(iVar2,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffa8,
               (char *)CONCAT44(in_stack_ffffffffffffffa4,iVar1),in_stack_ffffffffffffff9c);
  ::roaring::Roaring::~Roaring((Roaring *)CONCAT44(in_stack_ffffffffffffffa4,iVar1));
  return;
}

Assistant:

DEFINE_TEST(test_cpp_add_remove_checked) {
    Roaring roaring;
    uint32_t values[4] = {123, 9999, 0xFFFFFFF7, 0xFFFFFFFF};
    for (int i = 0; i < 4; ++i) {
        assert_true(roaring.addChecked(values[i]));
        assert_false(roaring.addChecked(values[i]));
    }
    for (int i = 0; i < 4; ++i) {
        assert_true(roaring.removeChecked(values[i]));
        assert_false(roaring.removeChecked(values[i]));
    }
    assert_true(roaring.isEmpty());
}